

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::PipelineCreateInfo::VertexInputState::VertexInputState
          (VertexInputState *this,deUint32 _vertexBindingDescriptionCount,
          VkVertexInputBindingDescription *_pVertexBindingDescriptions,
          deUint32 _vertexAttributeDescriptionCount,
          VkVertexInputAttributeDescription *_pVertexAttributeDescriptions)

{
  VkVertexInputAttributeDescription *_pVertexAttributeDescriptions_local;
  deUint32 _vertexAttributeDescriptionCount_local;
  VkVertexInputBindingDescription *_pVertexBindingDescriptions_local;
  deUint32 _vertexBindingDescriptionCount_local;
  VertexInputState *this_local;
  
  (this->super_VkPipelineVertexInputStateCreateInfo).sType =
       VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  (this->super_VkPipelineVertexInputStateCreateInfo).pNext = (void *)0x0;
  (this->super_VkPipelineVertexInputStateCreateInfo).flags = 0;
  (this->super_VkPipelineVertexInputStateCreateInfo).vertexBindingDescriptionCount =
       _vertexBindingDescriptionCount;
  (this->super_VkPipelineVertexInputStateCreateInfo).pVertexBindingDescriptions =
       _pVertexBindingDescriptions;
  (this->super_VkPipelineVertexInputStateCreateInfo).vertexAttributeDescriptionCount =
       _vertexAttributeDescriptionCount;
  (this->super_VkPipelineVertexInputStateCreateInfo).pVertexAttributeDescriptions =
       _pVertexAttributeDescriptions;
  return;
}

Assistant:

PipelineCreateInfo::VertexInputState::VertexInputState (deUint32										_vertexBindingDescriptionCount,
														const vk::VkVertexInputBindingDescription*		_pVertexBindingDescriptions,
														deUint32										_vertexAttributeDescriptionCount,
														const vk::VkVertexInputAttributeDescription*	_pVertexAttributeDescriptions)
{
	sType = vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
	pNext = DE_NULL;
	flags							= 0u;
	vertexBindingDescriptionCount	= _vertexBindingDescriptionCount;
	pVertexBindingDescriptions		= _pVertexBindingDescriptions;
	vertexAttributeDescriptionCount	= _vertexAttributeDescriptionCount;
	pVertexAttributeDescriptions	= _pVertexAttributeDescriptions;
}